

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O1

void __thiscall CmdLineArgsParser::ParseNumberSet(CmdLineArgsParser *this,NumberSet *numberPairSet)

{
  uint32 x;
  
  while( true ) {
    x = ParseInteger(this);
    Js::NumberSet::Add(numberPairSet,x);
    if (*this->pszCurrentArg != L';') break;
    this->pszCurrentArg = this->pszCurrentArg + 1;
  }
  return;
}

Assistant:

void
CmdLineArgsParser::ParseNumberSet(Js::NumberSet * numberPairSet)
{
    while (true)
    {
        int x = ParseInteger();
        numberPairSet->Add(x);

        if (CurChar() != ';')
        {
            break;
        }
        NextChar();
    }
}